

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O0

void __thiscall gimage::PNMImageIO::save(PNMImageIO *this,ImageU16 *image,char *name)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  char *in_RDX;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_RSI;
  long *in_RDI;
  failure *ex;
  store_t_conflict p;
  int j;
  long i;
  long k;
  streambuf *sb;
  ofstream out;
  string type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc48;
  byte local_389;
  string *in_stack_fffffffffffffc78;
  IOException *in_stack_fffffffffffffc80;
  int local_2d4;
  long local_2d0;
  long local_2c8;
  long local_2b8 [48];
  float in_stack_fffffffffffffecc;
  long in_stack_fffffffffffffed0;
  long in_stack_fffffffffffffed8;
  long in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  allocator local_b1;
  string local_b0 [35];
  undefined1 local_8d;
  allocator local_79;
  string local_78 [96];
  char *local_18;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar3 = (**(code **)(*in_RDI + 0x18))(in_RDI,in_RDX,0);
  if (((uVar3 & 1) != 0) &&
     ((iVar2 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getDepth(local_10),
      iVar2 == 1 ||
      (iVar2 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getDepth(local_10),
      iVar2 == 3)))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"P5",&local_b1);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    iVar2 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getDepth(local_10);
    if (iVar2 == 3) {
      std::__cxx11::string::operator=(local_b0,"P6");
    }
    std::__cxx11::string::c_str();
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth(local_10);
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight(local_10);
    anon_unknown_11::writePNMHeader
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    std::ofstream::ofstream(local_2b8);
    uVar4 = *(undefined8 *)(local_2b8[0] + -0x18);
    std::operator|(_S_failbit,_S_badbit);
    std::ios::exceptions((int)local_2b8 + (int)uVar4);
    std::operator|(_S_bin,_S_app);
    std::ofstream::open((char *)local_2b8,(_Ios_Openmode)local_18);
    cVar1 = std::ofstream::rdbuf();
    local_2c8 = 0;
    while( true ) {
      lVar6 = local_2c8;
      lVar5 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight(local_10);
      local_389 = 0;
      if (lVar6 < lVar5) {
        local_389 = std::ios::good();
      }
      if ((local_389 & 1) == 0) break;
      for (local_2d0 = 0;
          lVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth(local_10),
          local_2d0 < lVar6; local_2d0 = local_2d0 + 1) {
        for (local_2d4 = 0;
            iVar2 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getDepth(local_10),
            local_2d4 < iVar2; local_2d4 = local_2d4 + 1) {
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::get
                    (local_10,local_2d0,local_2c8,local_2d4);
          std::streambuf::sputc(cVar1);
          std::streambuf::sputc(cVar1);
        }
      }
      local_2c8 = local_2c8 + 1;
    }
    std::ofstream::close();
    std::ofstream::~ofstream(local_2b8);
    std::__cxx11::string::~string(local_b0);
    return;
  }
  local_8d = 1;
  uVar4 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,local_18,&local_79);
  std::operator+((char *)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  std::operator+(in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40);
  gutil::IOException::IOException(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  local_8d = 0;
  __cxa_throw(uVar4,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
}

Assistant:

void PNMImageIO::save(const ImageU16 &image, const char *name) const
{
  if (!handlesFile(name, false) || (image.getDepth() != 1 && image.getDepth() != 3))
  {
    throw gutil::IOException("Can only save PNM images with depth 1 or 3 ("+std::string(name)+")");
  }

  std::string type="P5";

  if (image.getDepth() == 3)
  {
    type="P6";
  }

  writePNMHeader(name, type.c_str(), image.getWidth(), image.getHeight(),
                 65535, 0);

  try
  {
    std::ofstream out;
    out.exceptions(std::ios_base::failbit | std::ios_base::badbit);
    out.open(name, std::ios::binary|std::ios::app);

    std::streambuf *sb=out.rdbuf();

    for (long k=0; k<image.getHeight() && out.good(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        for (int j=0; j<image.getDepth(); j++)
        {
          ImageU16::store_t p=image.get(i, k, j);

          sb->sputc(static_cast<char>((p>>8)&0xff));
          sb->sputc(static_cast<char>(p&0xff));
        }
      }
    }

    out.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }
}